

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-sched.cpp
# Opt level: O3

ggml_cgraph * gpt2_graph(gpt2_model *model,int n_past,vector<int,_std::allocator<int>_> *embd_inp)

{
  int iVar1;
  uint uVar2;
  pointer piVar3;
  pointer piVar4;
  ggml_tensor *pgVar5;
  ggml_cgraph *pgVar6;
  int iVar7;
  long lVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  undefined4 in_register_00000034;
  ulong uVar21;
  long lVar22;
  long lVar23;
  float fVar24;
  int32_t v;
  int local_cc;
  ulong local_c8;
  long local_c0;
  long local_b8;
  float local_ac;
  ggml_cgraph *local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  size_t local_48;
  pointer puStack_40;
  undefined1 local_38;
  
  local_c8 = CONCAT44(in_register_00000034,n_past);
  piVar3 = (embd_inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  piVar4 = (embd_inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  iVar1 = (model->hparams).n_embd;
  lVar8 = (long)iVar1;
  uVar2 = (model->hparams).n_layer;
  local_c0 = (long)(model->hparams).n_ctx;
  local_98 = (long)(model->hparams).n_head;
  if (gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)::buf_size == '\0'
     ) {
    iVar7 = __cxa_guard_acquire(&gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)
                                 ::buf_size);
    if (iVar7 != 0) {
      lVar11 = ggml_tensor_overhead();
      lVar23 = ggml_graph_overhead_custom(0x1000,0);
      gpt2_graph::buf_size = lVar23 + lVar11 * 0x1000;
      __cxa_guard_release(&gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)
                           ::buf_size);
    }
  }
  if (gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)::buf == '\0') {
    iVar7 = __cxa_guard_acquire(&gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)
                                 ::buf);
    if (iVar7 != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&gpt2_graph::buf,gpt2_graph::buf_size,(allocator_type *)&local_cc);
      __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                   &gpt2_graph::buf,&__dso_handle);
      __cxa_guard_release(&gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)
                           ::buf);
    }
  }
  local_48 = gpt2_graph::buf_size;
  puStack_40 = gpt2_graph::buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
  local_38 = 1;
  uVar9 = ggml_init();
  local_a8 = (ggml_cgraph *)ggml_new_graph_custom(uVar9,0x1000,0);
  uVar20 = (uint)((ulong)((long)piVar3 - (long)piVar4) >> 2);
  lVar23 = (long)(int)uVar20;
  uVar10 = ggml_view_1d(uVar9,model->embd,lVar23,0);
  pgVar5 = model->embd;
  piVar3 = (embd_inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  lVar11 = ggml_element_size(uVar10);
  ggml_backend_tensor_set(pgVar5,piVar3,0,lVar11 * lVar23);
  uVar12 = ggml_view_1d(uVar9,model->position,lVar23,0);
  local_b8 = lVar23;
  if (0 < (int)uVar20) {
    lVar11 = 0;
    uVar21 = local_c8 & 0xffffffff;
    do {
      local_cc = (int)uVar21;
      ggml_backend_tensor_set(model->position,&local_cc,lVar11,4);
      uVar21 = (ulong)((int)uVar21 + 1);
      lVar11 = lVar11 + 4;
    } while ((ulong)(uVar20 & 0x7fffffff) << 2 != lVar11);
  }
  fVar24 = (float)(model->hparams).n_embd / (float)(model->hparams).n_head;
  if (fVar24 < 0.0) {
    fVar24 = sqrtf(fVar24);
  }
  else {
    fVar24 = SQRT(fVar24);
  }
  uVar10 = ggml_get_rows(uVar9,model->wte,uVar10);
  uVar12 = ggml_get_rows(uVar9,model->wpe,uVar12);
  lVar11 = ggml_add(uVar9,uVar10,uVar12);
  ggml_set_name(lVar11,"inpL");
  ggml_set_name(*(undefined8 *)(lVar11 + 0x98),"wte");
  ggml_set_name(*(undefined8 *)(lVar11 + 0xa0),"wpe");
  if (0 < (int)uVar2) {
    local_ac = 1.0 / fVar24;
    local_60 = lVar8 * 4;
    local_68 = lVar8 * 8;
    local_88 = (long)(int)(iVar1 * uVar20);
    iVar7 = uVar20 + (int)local_c8;
    local_a0 = (long)iVar7;
    local_70 = (long)(iVar7 * iVar1);
    lVar17 = (int)local_c8 * lVar8;
    local_78 = local_c0 * lVar8;
    local_80 = (ulong)uVar2 * 0x60;
    lVar23 = 0;
    lVar19 = 0;
    uVar21 = 0;
    do {
      local_58 = lVar11;
      uVar10 = ggml_norm((model->hparams).eps,uVar9,lVar11);
      ggml_format_name(uVar10,"l%d.norm",uVar21 & 0xffffffff);
      uVar10 = ggml_mul(uVar9,uVar10,
                        *(undefined8 *)
                         ((long)&((model->layers).
                                  super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->ln_1_g + lVar23));
      lVar11 = ggml_add(uVar9,uVar10,
                        *(undefined8 *)
                         ((long)&((model->layers).
                                  super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->ln_1_b + lVar23));
      ggml_format_name(lVar11,"l%d.ln_1_b",uVar21 & 0xffffffff);
      ggml_format_name(*(undefined8 *)(lVar11 + 0x98),"l%d.ln_1_g",uVar21 & 0xffffffff);
      uVar10 = ggml_mul_mat(uVar9,*(undefined8 *)
                                   ((long)&((model->layers).
                                            super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                           c_attn_attn_w + lVar23),lVar11);
      ggml_format_name(uVar10,"l%d.attn_w",uVar21 & 0xffffffff);
      local_50 = lVar23;
      lVar23 = ggml_add(uVar9,uVar10,
                        *(undefined8 *)
                         ((long)&((model->layers).
                                  super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->c_attn_attn_b + lVar23)
                       );
      ggml_format_name(lVar23,"l%d.attn_b",uVar21 & 0xffffffff);
      lVar11 = local_b8;
      uVar10 = ggml_view_2d(uVar9,lVar23,lVar8,local_b8,*(undefined8 *)(lVar23 + 0x38),0);
      uVar12 = ggml_view_2d(uVar9,lVar23,lVar8,lVar11,*(undefined8 *)(lVar23 + 0x38),local_60);
      uVar13 = ggml_view_2d(uVar9,lVar23,lVar8,lVar11,*(undefined8 *)(lVar23 + 0x38),local_68);
      ggml_format_name(uVar10,"l%d.Qcur",uVar21 & 0xffffffff);
      ggml_format_name(uVar12,"l%d.Kcur",uVar21 & 0xffffffff);
      ggml_format_name(uVar13,"l%d.Vcur",uVar21 & 0xffffffff);
      local_90 = lVar19;
      if (0 < (int)lVar11) {
        pgVar5 = model->memory_k;
        lVar23 = ggml_element_size(pgVar5);
        lVar11 = local_88;
        local_90 = uVar21 * local_c0;
        uVar14 = ggml_view_1d(uVar9,pgVar5,local_88,lVar23 * lVar17);
        pgVar5 = model->memory_v;
        lVar23 = ggml_element_size(pgVar5);
        uVar15 = ggml_view_1d(uVar9,pgVar5,lVar11,lVar23 * lVar17);
        lVar11 = local_b8;
        uVar12 = ggml_cpy(uVar9,uVar12,uVar14);
        pgVar6 = local_a8;
        ggml_build_forward_expand(local_a8,uVar12);
        uVar12 = ggml_cpy(uVar9,uVar13,uVar15);
        ggml_build_forward_expand(pgVar6,uVar12);
      }
      lVar23 = local_98;
      lVar18 = (long)(iVar1 / (int)local_98);
      uVar10 = ggml_cont_3d(uVar9,uVar10,lVar18,local_98,lVar11);
      uVar10 = ggml_permute(uVar9,uVar10,0,2,1,3);
      ggml_format_name(uVar10,"l%d.Q",uVar21 & 0xffffffff);
      pgVar5 = model->memory_k;
      lVar16 = ggml_element_size(pgVar5);
      lVar11 = local_70;
      lVar22 = local_90 * lVar8;
      uVar12 = ggml_view_1d(uVar9,pgVar5,local_70,lVar16 * lVar22);
      uVar12 = ggml_reshape_3d(uVar9,uVar12,lVar18,lVar23,local_a0);
      uVar12 = ggml_permute(uVar9,uVar12,0,2,1,3);
      ggml_format_name(uVar12,"l%d.K",uVar21 & 0xffffffff);
      uVar10 = ggml_mul_mat(uVar9,uVar12,uVar10);
      ggml_format_name(uVar10,"l%d.KQ",uVar21 & 0xffffffff);
      uVar10 = ggml_scale(local_ac,uVar9,uVar10);
      ggml_format_name(uVar10,"l%d.KQ_scaled",uVar21 & 0xffffffff);
      uVar10 = ggml_diag_mask_inf(uVar9,uVar10,local_c8);
      ggml_format_name(uVar10,"l%d.KQ_masked",uVar21 & 0xffffffff);
      uVar10 = ggml_soft_max(uVar9,uVar10);
      ggml_format_name(uVar10,"l%d.KQ_soft_max",uVar21 & 0xffffffff);
      pgVar5 = model->memory_v;
      lVar23 = ggml_element_size(pgVar5);
      uVar12 = ggml_view_1d(uVar9,pgVar5,lVar11,lVar22 * lVar23);
      lVar23 = local_98;
      lVar11 = local_a0;
      uVar12 = ggml_reshape_3d(uVar9,uVar12,lVar18,local_98,local_a0);
      uVar12 = ggml_permute(uVar9,uVar12,1,2,0,3);
      uVar12 = ggml_cont_3d(uVar9,uVar12,lVar11,lVar18,lVar23);
      uVar10 = ggml_mul_mat(uVar9,uVar12,uVar10);
      ggml_format_name(uVar10,"l%d.KQV",uVar21 & 0xffffffff);
      uVar10 = ggml_permute(uVar9,uVar10,0,2,1);
      ggml_format_name(uVar10,"l%d.KQV_merged",uVar21 & 0xffffffff);
      uVar10 = ggml_cont_2d(uVar9,uVar10,lVar8,local_b8);
      ggml_format_name(uVar10,"l%d.KQV_merged_contiguous",uVar21 & 0xffffffff);
      lVar23 = local_50;
      uVar10 = ggml_mul_mat(uVar9,*(undefined8 *)
                                   ((long)&((model->layers).
                                            super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                           c_attn_proj_w + local_50),uVar10);
      ggml_format_name(uVar10,"l%d.attn_proj_w",uVar21 & 0xffffffff);
      uVar10 = ggml_add(uVar9,uVar10,
                        *(undefined8 *)
                         ((long)&((model->layers).
                                  super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->c_attn_proj_b + lVar23)
                       );
      ggml_format_name(uVar10,"l%d.attn_proj_b",uVar21 & 0xffffffff);
      uVar10 = ggml_add(uVar9,uVar10,local_58);
      ggml_format_name(uVar10,"l%d.add",uVar21 & 0xffffffff);
      uVar12 = ggml_norm((model->hparams).eps,uVar9,uVar10);
      ggml_format_name(uVar12,"l%d.FFnorm",uVar21 & 0xffffffff);
      uVar12 = ggml_mul(uVar9,uVar12,
                        *(undefined8 *)
                         ((long)&((model->layers).
                                  super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->ln_2_g + lVar23));
      lVar11 = ggml_add(uVar9,uVar12,
                        *(undefined8 *)
                         ((long)&((model->layers).
                                  super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->ln_2_b + lVar23));
      ggml_format_name(lVar11,"l%d.ln_2_b",uVar21 & 0xffffffff);
      ggml_format_name(*(undefined8 *)(lVar11 + 0x98),"l%d.ln_2_g",uVar21 & 0xffffffff);
      uVar12 = ggml_mul_mat(uVar9,*(undefined8 *)
                                   ((long)&((model->layers).
                                            super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->c_mlp_fc_w +
                                   lVar23),lVar11);
      ggml_format_name(uVar12,"l%d.mlp_fc_w",uVar21 & 0xffffffff);
      uVar12 = ggml_add(uVar9,uVar12,
                        *(undefined8 *)
                         ((long)&((model->layers).
                                  super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->c_mlp_fc_b + lVar23));
      ggml_format_name(uVar12,"l%d.mlp_fc_b",uVar21 & 0xffffffff);
      uVar12 = ggml_gelu(uVar9,uVar12);
      ggml_format_name(uVar12,"l%d.gelu",uVar21 & 0xffffffff);
      uVar12 = ggml_mul_mat(uVar9,*(undefined8 *)
                                   ((long)&((model->layers).
                                            super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->c_mlp_proj_w
                                   + lVar23),uVar12);
      ggml_format_name(uVar12,"l%d.mlp_proj_w",uVar21 & 0xffffffff);
      uVar12 = ggml_add(uVar9,uVar12,
                        *(undefined8 *)
                         ((long)&((model->layers).
                                  super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->c_mlp_proj_b + lVar23))
      ;
      ggml_format_name(uVar12,"l%d.mlp_proj_b",uVar21 & 0xffffffff);
      lVar11 = ggml_add(uVar9,uVar12,uVar10);
      ggml_format_name(lVar11,"l%d.add2",uVar21 & 0xffffffff);
      uVar21 = uVar21 + 1;
      lVar19 = lVar19 + local_c0;
      lVar17 = lVar17 + local_78;
      lVar23 = lVar23 + 0x60;
    } while (local_80 != lVar23);
  }
  uVar10 = ggml_norm((model->hparams).eps,uVar9,lVar11);
  ggml_format_name(uVar10,"out_norm");
  uVar10 = ggml_mul(uVar9,uVar10,model->ln_f_g);
  lVar8 = ggml_add(uVar9,uVar10,model->ln_f_b);
  ggml_format_name(lVar8,"out_ln_f_b");
  ggml_format_name(*(undefined8 *)(lVar8 + 0x98),"out_ln_f_g");
  uVar10 = ggml_mul_mat(uVar9,model->lm_head,lVar8);
  ggml_format_name(uVar10,"out_lm_head");
  pgVar6 = local_a8;
  ggml_build_forward_expand(local_a8,uVar10);
  ggml_free(uVar9);
  return pgVar6;
}

Assistant:

struct ggml_cgraph * gpt2_graph(
        const gpt2_model & model,
        const int n_past,
        const std::vector<gpt_vocab::id> & embd_inp) {
    const int N = embd_inp.size();

    const auto & hparams = model.hparams;

    const int n_embd  = hparams.n_embd;
    const int n_layer = hparams.n_layer;
    const int n_ctx   = hparams.n_ctx;
    const int n_head  = hparams.n_head;

    // since we are using ggml-alloc, this buffer only needs enough space to hold the ggml_tensor and ggml_cgraph structs, but not the tensor data
    static size_t buf_size = ggml_tensor_overhead()*GPT2_MAX_NODES + ggml_graph_overhead_custom(GPT2_MAX_NODES, false);
    static std::vector<uint8_t> buf(buf_size);

    struct ggml_init_params params = {
        /*.mem_size   =*/ buf_size,
        /*.mem_buffer =*/ buf.data(),
        /*.no_alloc   =*/ true, // the tensors will be allocated later by ggml_gallocr_alloc_graph()
    };

    struct ggml_context * ctx = ggml_init(params);

    struct ggml_cgraph  * gf = ggml_new_graph_custom(ctx, GPT2_MAX_NODES, false);

    struct ggml_tensor * embd = ggml_view_1d(ctx, model.embd, N, 0);

    // set inputs
    // TODO: move to gpt2_eval
    ggml_backend_tensor_set(model.embd, embd_inp.data(), 0, N*ggml_element_size(embd));

    struct ggml_tensor * position = ggml_view_1d(ctx, model.position, N, 0);
    for (int i = 0; i < N; ++i) {
        int32_t v = n_past + i;
        ggml_backend_tensor_set(model.position, &v, i*sizeof(int32_t), sizeof(v));
    }

    const float KQ_scale = 1.0f/sqrtf(float(model.hparams.n_embd)/model.hparams.n_head);

    // wte + wpe
    struct ggml_tensor * inpL =
        ggml_add(ctx,
                ggml_get_rows(ctx, model.wte, embd),
                ggml_get_rows(ctx, model.wpe, position));
    ggml_set_name(inpL, "inpL");
    ggml_set_name(inpL->src[0], "wte");
    ggml_set_name(inpL->src[1], "wpe");

    for (int il = 0; il < n_layer; ++il) {
        struct ggml_tensor * cur;

        // norm
        {
            // [ 768, N]
            cur = ggml_norm(ctx, inpL, hparams.eps);
            ggml_format_name(cur, "l%d.norm", il);

            // cur = ln_1_g*cur + ln_1_b
            // [ 768, N]
            cur = ggml_add(ctx,
                    ggml_mul(ctx,
                        cur,
                        model.layers[il].ln_1_g),
                    model.layers[il].ln_1_b);
            ggml_format_name(cur, "l%d.ln_1_b", il);
            ggml_format_name(cur->src[0], "l%d.ln_1_g", il);
        }

        // attn
        // [2304, 768] - model.layers[il].c_attn_attn_w
        // [2304,   1] - model.layers[il].c_attn_attn_b
        // [ 768,   N] - cur (in)
        // [2304,   N] - cur (out)
        //
        // cur = attn_w*cur + attn_b
        // [2304, N]
        {
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_attn_attn_w,
                    cur);
            ggml_format_name(cur, "l%d.attn_w", il);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_attn_attn_b);
            ggml_format_name(cur, "l%d.attn_b", il);
        }

        // self-attention
        {
            struct ggml_tensor * Qcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 0*sizeof(float)*n_embd);
            struct ggml_tensor * Kcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 1*sizeof(float)*n_embd);
            struct ggml_tensor * Vcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 2*sizeof(float)*n_embd);

            ggml_format_name(Qcur, "l%d.Qcur", il);
            ggml_format_name(Kcur, "l%d.Kcur", il);
            ggml_format_name(Vcur, "l%d.Vcur", il);

            // store key and value to memory
            if (N >= 1) {
                struct ggml_tensor * k = ggml_view_1d(ctx, model.memory_k, N*n_embd, (ggml_element_size(model.memory_k)*n_embd)*(il*n_ctx + n_past));
                struct ggml_tensor * v = ggml_view_1d(ctx, model.memory_v, N*n_embd, (ggml_element_size(model.memory_v)*n_embd)*(il*n_ctx + n_past));

                ggml_build_forward_expand(gf, ggml_cpy(ctx, Kcur, k));
                ggml_build_forward_expand(gf, ggml_cpy(ctx, Vcur, v));
            }

            // Q = Qcur.contiguous().view(n_embd/n_head, n_head, N).permute(0, 2, 1, 3)
            // [64, N, 12]
            struct ggml_tensor * Q =
                ggml_permute(ctx,
                        ggml_cont_3d(ctx, Qcur, n_embd/n_head, n_head, N),
                        0, 2, 1, 3);
            ggml_format_name(Q, "l%d.Q", il);

            // K = Kmem.view(n_embd/n_head, n_head, n_past + N).permute(0, 2, 1, 3)
            // [64, n_past + N, 12]
            struct ggml_tensor * K =
                ggml_permute(ctx,
                        ggml_reshape_3d(ctx,
                            ggml_view_1d(ctx, model.memory_k, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_k)*n_embd),
                            n_embd/n_head, n_head, n_past + N),
                        0, 2, 1, 3);
            ggml_format_name(K, "l%d.K", il);

            // GG: flash attention
            //struct ggml_tensor * V =
            //    ggml_cpy(ctx0,
            //            ggml_permute(ctx0,
            //                ggml_reshape_3d(ctx0,
            //                    ggml_view_1d(ctx0, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
            //                    n_embd/n_head, n_head, n_past + N),
            //                1, 2, 0, 3),
            //            ggml_new_tensor_3d(ctx0, GGML_TYPE_F32, n_past + N, n_embd/n_head, n_head));

            //struct ggml_tensor * KQV = ggml_flash_attn(ctx0, Q, K, V, true);

            // K * Q
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ = ggml_mul_mat(ctx, K, Q);
            ggml_format_name(KQ, "l%d.KQ", il);

            // KQ_scaled = KQ / sqrt(n_embd/n_head)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_scaled = ggml_scale(ctx, KQ, KQ_scale);
            ggml_format_name(KQ_scaled, "l%d.KQ_scaled", il);

            // KQ_masked = mask_past(KQ_scaled)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_masked = ggml_diag_mask_inf(ctx, KQ_scaled, n_past);
            ggml_format_name(KQ_masked, "l%d.KQ_masked", il);

            // KQ = soft_max(KQ_masked)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_soft_max = ggml_soft_max(ctx, KQ_masked);
            ggml_format_name(KQ_soft_max, "l%d.KQ_soft_max", il);

            // V_trans = Vmem.view(n_embd/n_head, n_head, n_past + N).permute(1, 2, 0, 3).contiguous()
            // [n_past + N, 64, 12]
            struct ggml_tensor * V_trans =
                ggml_cont_3d(ctx,
                        ggml_permute(ctx,
                            ggml_reshape_3d(ctx,
                                ggml_view_1d(ctx, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
                                n_embd/n_head, n_head, n_past + N),
                            1, 2, 0, 3),
                        n_past + N, n_embd/n_head, n_head);

            // KQV = transpose(V) * KQ_soft_max
            // [64, N, 12]
            struct ggml_tensor * KQV = ggml_mul_mat(ctx, V_trans, KQ_soft_max);
            ggml_format_name(KQV, "l%d.KQV", il);

            // KQV_merged = KQV.permute(0, 2, 1, 3)
            // [64, 12, N]
            struct ggml_tensor * KQV_merged = ggml_permute(ctx, KQV, 0, 2, 1, 3);
            ggml_format_name(KQV_merged, "l%d.KQV_merged", il);

            // cur = KQV_merged.contiguous().view(n_embd, N)
            // [768, N]
            cur = ggml_cont_2d(ctx, KQV_merged, n_embd, N);
            ggml_format_name(cur, "l%d.KQV_merged_contiguous", il);
        }

        // projection
        // [ 768, 768] - model.layers[il].c_attn_proj_w
        // [ 768,   1] - model.layers[il].c_attn_proj_b
        // [ 768,   N] - cur (in)
        // [ 768,   N] - cur (out)
        //
        // cur = proj_w*cur + proj_b
        // [768, N]
        {
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_attn_proj_w,
                    cur);
            ggml_format_name(cur, "l%d.attn_proj_w", il);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_attn_proj_b);
            ggml_format_name(cur, "l%d.attn_proj_b", il);
        }

        // add the input
        cur = ggml_add(ctx, cur, inpL);
        ggml_format_name(cur, "l%d.add", il);

        struct ggml_tensor * inpFF = cur;

        // feed-forward network
        {
            // norm
            {
                cur = ggml_norm(ctx, inpFF, hparams.eps);
                ggml_format_name(cur, "l%d.FFnorm", il);

                // cur = ln_2_g*cur + ln_2_b
                // [ 768, N]
                cur = ggml_add(ctx,
                        ggml_mul(ctx,
                            cur,
                            model.layers[il].ln_2_g),
                        model.layers[il].ln_2_b);
                ggml_format_name(cur, "l%d.ln_2_b", il);
                ggml_format_name(cur->src[0], "l%d.ln_2_g", il);
            }

            // fully connected
            // [3072, 768] - model.layers[il].c_mlp_fc_w
            // [3072,   1] - model.layers[il].c_mlp_fc_b
            // [ 768,   N] - cur (in)
            // [3072,   N] - cur (out)
            //
            // cur = fc_w*cur + fc_b
            // [3072, N]
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_mlp_fc_w,
                    cur);
            ggml_format_name(cur, "l%d.mlp_fc_w", il);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_mlp_fc_b);
            ggml_format_name(cur, "l%d.mlp_fc_b", il);

            // GELU activation
            // [3072, N]
            cur = ggml_gelu(ctx, cur);
            ggml_format_name(cur, "l%d.gelu", il);

            // projection
            // [ 768, 3072] - model.layers[il].c_mlp_proj_w
            // [ 768,    1] - model.layers[il].c_mlp_proj_b
            // [3072,    N] - cur (in)
            // [ 768,    N] - cur (out)
            //
            // cur = proj_w*cur + proj_b
            // [768, N]
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_mlp_proj_w,
                    cur);
            ggml_format_name(cur, "l%d.mlp_proj_w", il);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_mlp_proj_b);
            ggml_format_name(cur, "l%d.mlp_proj_b", il);
        }

        // input for next layer
        inpL = ggml_add(ctx, cur, inpFF);
        ggml_format_name(inpL, "l%d.add2", il);
    }

    // norm
    {
        // [ 768, N]
        inpL = ggml_norm(ctx, inpL, hparams.eps);
        ggml_format_name(inpL, "out_norm");

        // inpL = ln_f_g*inpL + ln_f_b
        // [ 768, N]
        inpL = ggml_add(ctx,
                ggml_mul(ctx,
                    inpL,
                    model.ln_f_g),
                model.ln_f_b);
        ggml_format_name(inpL, "out_ln_f_b");
        ggml_format_name(inpL->src[0], "out_ln_f_g");
    }

    // inpL = WTE * inpL
    // [ 768, 50257] - model.lm_head
    // [ 768, N]     - inpL
    inpL = ggml_mul_mat(ctx, model.lm_head, inpL);
    ggml_format_name(inpL, "out_lm_head");

    // logits -> probs
    //inpL = ggml_soft_max(ctx0, inpL);

    ggml_build_forward_expand(gf, inpL);

    ggml_free(ctx);

    return gf;
}